

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRConstant * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::
allocate<unsigned_int&,diligent_spirv_cross::SPIRConstant_const*(&)[4],unsigned_int&,bool>
          (ObjectPool<diligent_spirv_cross::SPIRConstant> *this,uint *p,SPIRConstant *(*p_1) [4],
          uint *p_2,bool *p_3)

{
  Vector<diligent_spirv_cross::SPIRConstant_*> *this_00;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRConstant_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>
  _Var1;
  SPIRConstant *this_01;
  _Head_base<0UL,_diligent_spirv_cross::SPIRConstant_*,_false> _Var2;
  size_t sVar3;
  ulong count;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var1.super__Head_base<0UL,_diligent_spirv_cross::SPIRConstant_*,_false>._M_head_impl =
         (_Head_base<0UL,_diligent_spirv_cross::SPIRConstant_*,_false>)malloc(count * 0x168);
    if (_Var1.super__Head_base<0UL,_diligent_spirv_cross::SPIRConstant_*,_false>._M_head_impl ==
        (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>.buffer_size;
      _Var2._M_head_impl =
           (SPIRConstant *)
           _Var1.super__Head_base<0UL,_diligent_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      do {
        SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>.buffer_size;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>.ptr[sVar3] =
             _Var2._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>.buffer_size = sVar3;
        _Var2._M_head_impl = _Var2._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
              .buffer_size + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRConstant_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>
    .super__Head_base<0UL,_diligent_spirv_cross::SPIRConstant_*,_false> =
         _Var1.super__Head_base<0UL,_diligent_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_007bc5be;
  }
  else {
    this_01 = (this_00->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).ptr[sVar3 - 1];
  }
  SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_007bc5be:
  SPIRConstant::SPIRConstant(this_01,(TypeID)*p,*p_1,*p_2,*p_3);
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}